

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap.c
# Opt level: O2

map_t * remap_init(uint32 n_hashed)

{
  uint uVar1;
  map_t *pmVar2;
  mapping_t *pmVar3;
  uint32 *puVar4;
  ulong uVar5;
  uint uVar6;
  uint32 l;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  
  uVar1 = n_hashed * 3;
  uVar5 = (ulong)uVar1;
  do {
    dVar10 = ceil(SQRT((double)uVar5));
    uVar6 = (uint)(long)dVar10;
    uVar8 = 2;
    if (2 < uVar6) {
      uVar8 = uVar6;
    }
    uVar9 = 2;
    while (uVar7 = (uint)uVar9, uVar7 < uVar6) {
      if ((int)(uVar5 % uVar9) == 0) {
        uVar5 = (ulong)((int)uVar5 + 1);
        uVar8 = uVar7;
        break;
      }
      uVar9 = (ulong)(uVar7 + 1);
    }
    uVar7 = (uint)uVar5;
    if (uVar8 == uVar6) goto LAB_001268e7;
  } while (uVar7 != uVar1);
  fprintf(_stderr,"next_prime: failed to find next prime for %d\n",(ulong)uVar1);
  uVar7 = uVar1;
LAB_001268e7:
  pmVar2 = (map_t *)__ckd_calloc__(1,0x20,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                                   ,0x62);
  pmVar3 = (mapping_t *)
           __ckd_calloc__((ulong)uVar7,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                          ,100);
  pmVar2->map = pmVar3;
  puVar4 = (uint32 *)
           __ckd_calloc__((ulong)n_hashed,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/remap.c"
                          ,0x65);
  pmVar2->inv = puVar4;
  pmVar2->n_map = uVar7;
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    pmVar2->map[uVar5].x = 0xffffffff;
  }
  return pmVar2;
}

Assistant:

map_t *
remap_init(uint32 n_hashed)
{
    map_t *new;
    unsigned int i;
    uint32 size;

    size = next_prime(n_hashed * 3);

    new = ckd_calloc(1, sizeof(map_t));

    new->map = ckd_calloc(size, sizeof(mapping_t));
    new->inv = ckd_calloc(n_hashed, sizeof(uint32));
    new->n_map = size;

    for (i = 0; i < size; i++) {
	new->map[i].x = FREE_MAPPING;
    }

    return new;
}